

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O0

bool __thiscall MetaCommand::ParseXML(MetaCommand *this,char *buffer)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  long lVar5;
  Field field;
  string f;
  uint i;
  long posF;
  uint n;
  Option option;
  long pos;
  string buf;
  MetaCommand *in_stack_fffffffffffffc58;
  int in_stack_fffffffffffffc60;
  int in_stack_fffffffffffffc64;
  int in_stack_fffffffffffffc68;
  TypeEnumType in_stack_fffffffffffffc6c;
  string *in_stack_fffffffffffffc70;
  string local_350 [32];
  string local_330 [32];
  string local_310 [32];
  string local_2f0 [32];
  string local_2d0 [32];
  string local_2b0 [16];
  unsigned_long in_stack_fffffffffffffd60;
  char *in_stack_fffffffffffffd68;
  char *in_stack_fffffffffffffd70;
  MetaCommand *in_stack_fffffffffffffd78;
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  TypeEnumType local_1f0;
  undefined4 local_1ec;
  undefined1 local_1a8;
  undefined1 local_1a7;
  string local_1a0 [36];
  uint local_17c;
  long local_178;
  string local_170 [36];
  uint local_14c;
  string local_148 [32];
  string local_128 [32];
  string local_108 [48];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [56];
  undefined1 local_40;
  long local_38;
  string local_30 [48];
  
  std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::clear
            ((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)0x1288e0);
  GetXML_abi_cxx11_(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                    in_stack_fffffffffffffd60);
  local_38 = 0;
  while (bVar1 = std::__cxx11::string::empty(), ((bVar1 ^ 0xff) & 1) != 0) {
    Option::Option((Option *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
    std::__cxx11::string::c_str();
    GetXML_abi_cxx11_(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                      in_stack_fffffffffffffd60);
    std::__cxx11::string::operator=(local_b8,local_d8);
    std::__cxx11::string::~string(local_d8);
    std::__cxx11::string::c_str();
    GetXML_abi_cxx11_(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                      in_stack_fffffffffffffd60);
    std::__cxx11::string::operator=(local_78,local_108);
    std::__cxx11::string::~string(local_108);
    std::__cxx11::string::c_str();
    GetXML_abi_cxx11_(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                      in_stack_fffffffffffffd60);
    std::__cxx11::string::operator=(local_98,local_128);
    std::__cxx11::string::~string(local_128);
    std::__cxx11::string::c_str();
    GetXML_abi_cxx11_(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                      in_stack_fffffffffffffd60);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    iVar2 = atoi(pcVar4);
    std::__cxx11::string::~string(local_148);
    local_40 = iVar2 != 0;
    std::__cxx11::string::c_str();
    GetXML_abi_cxx11_(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                      in_stack_fffffffffffffd60);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    uVar3 = atoi(pcVar4);
    std::__cxx11::string::~string(local_170);
    local_14c = uVar3;
    local_178 = std::__cxx11::string::find((char *)local_30,0x1d786b);
    for (local_17c = 0; local_17c < local_14c; local_17c = local_17c + 1) {
      std::__cxx11::string::c_str();
      GetXML_abi_cxx11_(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
                        in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
      Field::Field((Field *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
      local_1a7 = 0;
      std::__cxx11::string::c_str();
      GetXML_abi_cxx11_(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
                        in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
      std::__cxx11::string::operator=(local_250,local_270);
      std::__cxx11::string::~string(local_270);
      std::__cxx11::string::c_str();
      GetXML_abi_cxx11_(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
                        in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
      std::__cxx11::string::operator=(local_230,(string *)&stack0xfffffffffffffd70);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd70);
      std::__cxx11::string::c_str();
      GetXML_abi_cxx11_(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
                        in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
      in_stack_fffffffffffffc70 = local_2b0;
      std::__cxx11::string::operator=(local_210,in_stack_fffffffffffffc70);
      std::__cxx11::string::~string(in_stack_fffffffffffffc70);
      std::__cxx11::string::c_str();
      GetXML_abi_cxx11_(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
                        in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
      std::__cxx11::string::c_str();
      in_stack_fffffffffffffc6c = StringToType(in_stack_fffffffffffffc58,(char *)0x128ceb);
      local_1f0 = in_stack_fffffffffffffc6c;
      std::__cxx11::string::~string(local_2d0);
      std::__cxx11::string::c_str();
      GetXML_abi_cxx11_(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
                        in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      in_stack_fffffffffffffc68 = atoi(pcVar4);
      std::__cxx11::string::~string(local_2f0);
      if (in_stack_fffffffffffffc68 == 0) {
        local_1ec = 0;
      }
      else {
        std::__cxx11::string::c_str();
        GetXML_abi_cxx11_(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
                          in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        in_stack_fffffffffffffc64 = atoi(pcVar4);
        std::__cxx11::string::~string(local_310);
        if (in_stack_fffffffffffffc64 == 1) {
          local_1ec = 1;
        }
        else {
          local_1ec = 2;
        }
      }
      std::__cxx11::string::c_str();
      GetXML_abi_cxx11_(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
                        in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      in_stack_fffffffffffffc60 = atoi(pcVar4);
      std::__cxx11::string::~string(local_330);
      local_1a8 = in_stack_fffffffffffffc60 != 0;
      std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::push_back
                ((vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_> *)
                 in_stack_fffffffffffffc70,
                 (value_type *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
      lVar5 = std::__cxx11::string::size();
      local_178 = lVar5 + 8 + local_178;
      Field::~Field((Field *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
      std::__cxx11::string::~string(local_1a0);
    }
    std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::push_back
              ((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)
               in_stack_fffffffffffffc70,
               (value_type *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68));
    lVar5 = std::__cxx11::string::size();
    local_38 = lVar5 + 0x11 + local_38;
    GetXML_abi_cxx11_(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                      in_stack_fffffffffffffd60);
    std::__cxx11::string::operator=(local_30,local_350);
    std::__cxx11::string::~string(local_350);
    Option::~Option((Option *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
  }
  std::__cxx11::string::~string(local_30);
  return true;
}

Assistant:

bool MetaCommand::ParseXML(const char* buffer)
{
  m_OptionVector.clear();
  METAIO_STL::string buf = this->GetXML(buffer,"option",0);
  long pos = 0;
  while (!buf.empty()) {
    Option option;
    option.name = this->GetXML(buf.c_str(),"name",0);
    option.tag = this->GetXML(buf.c_str(),"tag",0);
    option.description = this->GetXML(buf.c_str(),"description",0);
    if(atoi(this->GetXML(buf.c_str(),"required",0).c_str()) == 0)
      {
      option.required = false;
      }
    else
      {
      option.required = true;
      }
    unsigned int n = atoi(this->GetXML(buf.c_str(),"nvalues",0).c_str());

    // Now check the fields
    long posF = static_cast<long>(buf.find("<field>"));
    for(unsigned int i=0;i<n;i++)
      {
      METAIO_STL::string f = this->GetXML(buf.c_str(),"field",posF);
      Field field;
      field.userDefined = false;
      field.name = this->GetXML(f.c_str(),"name",0);
      field.description = this->GetXML(f.c_str(),"description",0);
      field.value = this->GetXML(f.c_str(),"value",0);
      field.type = this->StringToType(this->GetXML(f.c_str(),"type",0).c_str());
      if(atoi(this->GetXML(f.c_str(),"external",0).c_str()) == 0)
        {
        field.externaldata = DATA_NONE;
        }
      else
        {
        if(atoi(this->GetXML(f.c_str(),"external",0).c_str()) == 1)
          {
          field.externaldata = DATA_IN;
          }
        else
          {
          field.externaldata = DATA_OUT;
          }
        }
      if(atoi(this->GetXML(f.c_str(),"required",0).c_str()) == 0)
        {
        field.required = false;
        }
      else
        {
        field.required = true;
        }

      option.fields.push_back(field);
      posF += static_cast<long>(f.size())+8;
      }

    m_OptionVector.push_back(option);

    pos += static_cast<long>(buf.size())+17;
    buf = this->GetXML(buffer,"option",pos);
  }

  return true;
}